

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsObjectDeleteProperty
          (JsValueRef object,JsValueRef propertyId,bool useStrictRules,JsValueRef *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsErrorCode JVar5;
  JsrtContext *pJVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  undefined7 in_register_00000011;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_70 [8];
  EnterScriptObject __enterScriptObject;
  PropertyRecord *local_40;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar6 = JsrtContext::GetCurrent();
  if (pJVar6 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  __enterScriptObject.library._4_4_ = (undefined4)CONCAT71(in_register_00000011,useStrictRules);
  scriptContext = (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_a8 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_70,scriptContext,(ScriptEntryExitRecord *)auStack_a8,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_70);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x743,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_00377f6d;
    *puVar7 = 0;
  }
  JVar5 = JsErrorInvalidArgument;
  if (object != (JsValueRef)0x0) {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      JVar5 = JsErrorArgumentNotObject;
    }
    else {
      pRVar8 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar5 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00377c62;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar8,false);
      }
      JVar5 = JsErrorInvalidArgument;
      if ((ulong)propertyId >> 0x30 == 0 && propertyId != (JsValueRef)0x0) {
        pRVar8 = Js::VarTo<Js::RecyclableObject>(propertyId);
        pSVar1 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if (pSVar1 != scriptContext) {
          JVar5 = JsErrorWrongRuntime;
          if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00377c62;
          propertyId = Js::CrossSite::MarshalVar(scriptContext,pRVar8,false);
        }
        if (result == (JsValueRef *)0x0) {
          JVar5 = JsErrorNullArgument;
        }
        else {
          *result = (JsValueRef)0x0;
          local_40 = (PropertyRecord *)0x0;
          pRVar8 = Js::VarTo<Js::RecyclableObject>(propertyId);
          JVar5 = InternalGetPropertyRecord(scriptContext,pRVar8,&local_40);
          if (JVar5 == JsNoError) {
            if (local_40 == (PropertyRecord *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                                 ,0x753,"(propertyRecord != nullptr)","propertyRecord != nullptr");
              if (!bVar3) goto LAB_00377f6d;
              *puVar7 = 0;
            }
            JVar5 = JsNoError;
            JsDeletePropertyCommon
                      (scriptContext,object,local_40,__enterScriptObject.library._4_1_,result);
          }
        }
      }
    }
  }
LAB_00377c62:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_70);
  if ((((JVar5 & 0x6ffff) == JsErrorOutOfMemory) ||
      (((JVar5 - JsErrorNoCurrentContext < 7 &&
        ((0x43U >> (JVar5 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar5 == JsErrorFatal)))
      ) || (JVar5 == JsErrorScriptTerminated)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0xcc,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
LAB_00377f6d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  return JVar5;
}

Assistant:

CHAKRA_API JsObjectDeleteProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId,
    _In_ bool useStrictRules, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        PARAM_NOT_NULL(result);
        *result = nullptr;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Assert(propertyRecord != nullptr);

        return JsDeletePropertyCommon(scriptContext, object, propertyRecord,
            useStrictRules, result);
    });
}